

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void finish_pass_gather_phuff(j_compress_ptr cinfo)

{
  long lVar1;
  JHUFF_TBL *pJVar2;
  long in_RDI;
  bool bVar3;
  boolean did [4];
  JHUFF_TBL **htblptr;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  boolean is_DC_band;
  phuff_entropy_ptr entropy;
  long *in_stack_00000820;
  JHUFF_TBL *in_stack_00000828;
  j_compress_ptr in_stack_00000830;
  int aiStack_48 [2];
  phuff_entropy_ptr in_stack_ffffffffffffffc0;
  long *local_30;
  int local_1c;
  int local_18;
  
  emit_eobrun(in_stack_ffffffffffffffc0);
  bVar3 = *(int *)(in_RDI + 0x19c) != 0;
  memset(aiStack_48,0,0x10);
  local_18 = 0;
  do {
    if (*(int *)(in_RDI + 0x144) <= local_18) {
      return;
    }
    lVar1 = *(long *)(in_RDI + 0x148 + (long)local_18 * 8);
    if (bVar3) {
      local_1c = *(int *)(lVar1 + 0x18);
LAB_001381c3:
      if (aiStack_48[local_1c] == 0) {
        if (bVar3) {
          local_30 = (long *)(in_RDI + 0xa0 + (long)local_1c * 8);
        }
        else {
          local_30 = (long *)(in_RDI + 0x80 + (long)local_1c * 8);
        }
        if (*local_30 == 0) {
          pJVar2 = jpeg_alloc_huff_table((j_common_ptr)in_stack_ffffffffffffffc0);
          *local_30 = (long)pJVar2;
        }
        jpeg_gen_optimal_table(in_stack_00000830,in_stack_00000828,in_stack_00000820);
        aiStack_48[local_1c] = 1;
      }
    }
    else if (*(int *)(in_RDI + 0x1a4) == 0) {
      local_1c = *(int *)(lVar1 + 0x14);
      goto LAB_001381c3;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
finish_pass_gather_phuff(j_compress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  boolean is_DC_band;
  int ci, tbl;
  jpeg_component_info *compptr;
  JHUFF_TBL **htblptr;
  boolean did[NUM_HUFF_TBLS];

  /* Flush out buffered data (all we care about is counting the EOB symbol) */
  emit_eobrun(entropy);

  is_DC_band = (cinfo->Ss == 0);

  /* It's important not to apply jpeg_gen_optimal_table more than once
   * per table, because it clobbers the input frequency counts!
   */
  MEMZERO(did, sizeof(did));

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (is_DC_band) {
      if (cinfo->Ah != 0)       /* DC refinement needs no table */
        continue;
      tbl = compptr->dc_tbl_no;
    } else {
      tbl = compptr->ac_tbl_no;
    }
    if (!did[tbl]) {
      if (is_DC_band)
        htblptr = &cinfo->dc_huff_tbl_ptrs[tbl];
      else
        htblptr = &cinfo->ac_huff_tbl_ptrs[tbl];
      if (*htblptr == NULL)
        *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      jpeg_gen_optimal_table(cinfo, *htblptr, entropy->count_ptrs[tbl]);
      did[tbl] = TRUE;
    }
  }
}